

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::String::_opChars(String *this,ModifyOp op,char c,size_t n)

{
  char *__s;
  Error EVar1;
  
  EVar1 = 0;
  if (n != 0) {
    __s = prepare(this,op,n);
    if (__s == (char *)0x0) {
      EVar1 = 1;
    }
    else {
      memset(__s,(uint)(byte)c,n);
      EVar1 = 0;
    }
  }
  return EVar1;
}

Assistant:

Error String::_opChars(ModifyOp op, char c, size_t n) noexcept {
  if (!n)
    return kErrorOk;

  char* p = prepare(op, n);
  if (!p)
    return DebugUtils::errored(kErrorOutOfMemory);

  memset(p, c, n);
  return kErrorOk;
}